

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kp_chrome_tracing.cpp
# Opt level: O3

void __thiscall
KokkosTools::ChromeTracing::State::begin_deep_copy
          (State *this,Space dst,char *dst_name,void *param_3,Space src,char *src_name,void *param_6
          ,uint64_t len)

{
  bool bVar1;
  char cVar2;
  uint64_t uVar3;
  char cVar4;
  string __str;
  char *local_68;
  undefined8 local_60;
  char local_58;
  undefined7 uStack_57;
  long *local_48;
  uint local_40;
  long local_38 [2];
  
  local_60 = 0;
  local_58 = '\0';
  local_68 = &local_58;
  std::__cxx11::string::append((char *)&local_68);
  std::__cxx11::string::append((char *)&local_68);
  std::__cxx11::string::push_back((char)&local_68);
  std::__cxx11::string::append((char *)&local_68);
  std::__cxx11::string::append((char *)&local_68);
  std::__cxx11::string::append((char *)&local_68);
  std::__cxx11::string::push_back((char)&local_68);
  std::__cxx11::string::append((char *)&local_68);
  cVar4 = '\x01';
  if (9 < len) {
    uVar3 = len;
    cVar2 = '\x04';
    do {
      cVar4 = cVar2;
      if (uVar3 < 100) {
        cVar4 = cVar4 + -2;
        goto LAB_00103b62;
      }
      if (uVar3 < 1000) {
        cVar4 = cVar4 + -1;
        goto LAB_00103b62;
      }
      if (uVar3 < 10000) goto LAB_00103b62;
      bVar1 = 99999 < uVar3;
      uVar3 = uVar3 / 10000;
      cVar2 = cVar4 + '\x04';
    } while (bVar1);
    cVar4 = cVar4 + '\x01';
  }
LAB_00103b62:
  local_48 = local_38;
  std::__cxx11::string::_M_construct((ulong)&local_48,cVar4);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_48,local_40,len);
  std::__cxx11::string::_M_append((char *)&local_68,(ulong)local_48);
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  std::__cxx11::string::append((char *)&local_68);
  begin_frame(this,local_68,STACK_COPY);
  if (local_68 != &local_58) {
    operator_delete(local_68,CONCAT71(uStack_57,local_58) + 1);
  }
  return;
}

Assistant:

void begin_deep_copy(Space dst, const char *dst_name, const void *, Space src,
                       const char *src_name, const void *, std::uint64_t len) {
    std::string frame_name;
    frame_name += dst_name;
    frame_name += " SPACE ";
    frame_name += (dst == SPACE_HOST) ? 'H' : 'D';
    frame_name += " COPYFROM ";
    frame_name += src_name;
    frame_name += " SPACE ";
    frame_name += (src == SPACE_HOST) ? 'H' : 'D';
    frame_name += " LENGTH ";
    frame_name += std::to_string(len);
    frame_name += " ";
    begin_frame(frame_name.c_str(), STACK_COPY);
  }